

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpath_error.hpp
# Opt level: O2

void __thiscall jsoncons::jsonpath::jsonpath_error::~jsonpath_error(jsonpath_error *this,void **vtt)

{
  void *pvVar1;
  
  pvVar1 = *vtt;
  *(void **)this = pvVar1;
  *(void **)(&this->super_system_error + *(long *)((long)pvVar1 + -0x18)) = vtt[1];
  std::__cxx11::string::~string((string *)&this->what_);
  std::system_error::~system_error(&this->super_system_error);
  return;
}

Assistant:

~jsonpath_error() override = default;